

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::GeneratedMessageFactory::RegisterFile
          (GeneratedMessageFactory *this,char *file,RegistrationFunc *registration_func)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogFinisher local_65 [13];
  LogMessage local_58;
  RegistrationFunc *local_20;
  RegistrationFunc *registration_func_local;
  char *file_local;
  GeneratedMessageFactory *this_local;
  
  local_20 = registration_func;
  registration_func_local = (RegistrationFunc *)file;
  file_local = (char *)this;
  bVar1 = InsertIfNotPresent<google::protobuf::hash_map<char_const*,void(*)(std::__cxx11::string_const&),google::protobuf::hash<char_const*>,google::protobuf::streq,std::allocator<std::pair<char_const*const,void(*)(std::__cxx11::string_const&)>>>>
                    (&this->file_map_,(first_type *)&registration_func_local,
                     (second_type *)&local_20);
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,299);
    pLVar2 = internal::LogMessage::operator<<(&local_58,"File is already registered: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,(char *)registration_func_local);
    internal::LogFinisher::operator=(local_65,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return;
}

Assistant:

void GeneratedMessageFactory::RegisterFile(
    const char* file, RegistrationFunc* registration_func) {
  if (!InsertIfNotPresent(&file_map_, file, registration_func)) {
    GOOGLE_LOG(FATAL) << "File is already registered: " << file;
  }
}